

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<float_*,_10>::TPZManVector(TPZManVector<float_*,_10> *this,TPZVec<float_*> *copy)

{
  ulong uVar1;
  float **ppfVar2;
  ulong uVar3;
  
  (this->super_TPZVec<float_*>).fStore = (float **)0x0;
  (this->super_TPZVec<float_*>).fNElements = 0;
  (this->super_TPZVec<float_*>).fNAlloc = 0;
  (this->super_TPZVec<float_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841c60;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 0xb) {
    ppfVar2 = this->fExtAlloc;
    uVar3 = 0;
  }
  else {
    ppfVar2 = (float **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    uVar3 = uVar1;
  }
  (this->super_TPZVec<float_*>).fStore = ppfVar2;
  (this->super_TPZVec<float_*>).fNElements = uVar1;
  (this->super_TPZVec<float_*>).fNAlloc = uVar3;
  if (0 < (long)uVar1) {
    uVar3 = 0;
    do {
      (this->super_TPZVec<float_*>).fStore[uVar3] = copy->fStore[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}